

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall antlr::Parser::reportError(Parser *this,string *s)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  long *in_RDI;
  char *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  string local_60 [48];
  string local_30 [48];
  
  (**(code **)(*in_RDI + 0x40))();
  bVar1 = std::operator==(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::__cxx11::string::~string(local_30);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"error: ");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    poVar3 = std::operator<<(poVar3,pcVar2);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    (**(code **)(*in_RDI + 0x40))();
    pcVar2 = (char *)std::__cxx11::string::c_str();
    poVar3 = std::operator<<((ostream *)&std::cerr,pcVar2);
    poVar3 = std::operator<<(poVar3,": error: ");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    poVar3 = std::operator<<(poVar3,pcVar2);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_60);
  }
  return;
}

Assistant:

void Parser::reportError(const ANTLR_USE_NAMESPACE(std)string& s)
{
	if ( getFilename()=="" )
		ANTLR_USE_NAMESPACE(std)cerr << "error: " << s.c_str() << ANTLR_USE_NAMESPACE(std)endl;
	else
		ANTLR_USE_NAMESPACE(std)cerr << getFilename().c_str() << ": error: " << s.c_str() << ANTLR_USE_NAMESPACE(std)endl;
}